

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

string * __thiscall
OpenSSLWrapper::SslConnection::GetSslErrAsString_abi_cxx11_
          (string *__return_storage_ptr__,SslConnection *this)

{
  ulong uVar1;
  string buf;
  char *local_50;
  size_t local_48;
  char local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = ERR_get_error();
  while ((uVar1 & 0xffffffff) != 0) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,'\0');
    ERR_error_string_n(uVar1 & 0xffffffff,local_50,local_48);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    uVar1 = ERR_get_error();
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string SslConnection::GetSslErrAsString()
    {
        /*BIO *bio = BIO_new(BIO_s_mem());
        ERR_print_errors(bio);
        char *buf = NULL;
        size_t len = BIO_get_mem_data(bio, &buf);
        string strTmp(buf, len);
        BIO_free(bio);*/

        string strTmp;
        uint32_t nError = ERR_get_error();
        while (nError != 0)
        {
            string buf(512, 0);
            ERR_error_string_n(nError, &buf[0], buf.size());
            strTmp += &buf[0];
            strTmp += "\r\n";
            nError = ERR_get_error();
        }
        return strTmp;
    }